

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_interpolation.c
# Opt level: O1

int gdTransformAffineBoundingBox(gdRectPtr src,double *affine,gdRectPtr bbox)

{
  double dVar1;
  int iVar2;
  gdPointFPtr dst;
  long lVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  gdPointF point;
  gdPointF local_78;
  double local_68 [6];
  gdPointF local_38;
  
  local_78.x = 0.0;
  local_78.y = 0.0;
  local_68[0] = (double)src->width;
  local_68[1] = 0.0;
  local_68[2] = (double)src->width;
  local_68[3] = (double)src->height;
  local_68[4] = 0.0;
  local_68[5] = (double)src->height;
  lVar3 = 0;
  do {
    dst = (gdPointFPtr)((long)&local_78.x + lVar3);
    local_38.x = dst->x;
    local_38.y = *(double *)((long)local_68 + lVar3 + -8);
    iVar2 = gdAffineApplyToPointF(dst,&local_38,affine);
    if (iVar2 != 1) {
      return 0;
    }
    lVar3 = lVar3 + 0x10;
  } while (lVar3 != 0x40);
  lVar3 = 0;
  uVar4 = SUB84(local_78.x,0);
  uVar6 = (int)((ulong)local_78.x >> 0x20);
  dVar8 = local_78.x;
  dVar10 = local_78.y;
  dVar12 = local_78.y;
  do {
    dVar1 = *(double *)((long)local_68 + lVar3);
    dVar13 = *(double *)((long)local_68 + lVar3 + 8);
    dVar9 = dVar1;
    if (dVar8 <= dVar1) {
      dVar9 = dVar8;
    }
    dVar11 = dVar13;
    if (dVar10 <= dVar13) {
      dVar11 = dVar10;
    }
    uVar5 = SUB84(dVar1,0);
    uVar7 = (int)((ulong)dVar1 >> 0x20);
    if (dVar1 <= (double)CONCAT44(uVar6,uVar4)) {
      uVar5 = uVar4;
      uVar7 = uVar6;
    }
    if (dVar13 <= dVar12) {
      dVar13 = dVar12;
    }
    lVar3 = lVar3 + 0x10;
    uVar4 = uVar5;
    uVar6 = uVar7;
    dVar8 = dVar9;
    dVar10 = dVar11;
    dVar12 = dVar13;
  } while (lVar3 != 0x30);
  bbox->x = (int)dVar9;
  bbox->y = (int)dVar11;
  dVar8 = ceil((double)CONCAT44(uVar7,uVar5) - dVar9);
  bbox->width = (int)dVar8 + 1;
  dVar8 = ceil(dVar13 - dVar11);
  bbox->height = (int)dVar8 + 1;
  return 1;
}

Assistant:

BGD_DECLARE(int) gdTransformAffineBoundingBox(gdRectPtr src, const double affine[6], gdRectPtr bbox)
{
	gdPointF extent[4], min, max, point;
	int i;

	extent[0].x=0.0;
	extent[0].y=0.0;
	extent[1].x=(double) src->width;
	extent[1].y=0.0;
	extent[2].x=(double) src->width;
	extent[2].y=(double) src->height;
	extent[3].x=0.0;
	extent[3].y=(double) src->height;

	for (i=0; i < 4; i++) {
		point=extent[i];
		if (gdAffineApplyToPointF(&extent[i], &point, affine) != GD_TRUE) {
			return GD_FALSE;
		}
	}
	min=extent[0];
	max=extent[0];

	for (i=1; i < 4; i++) {
		if (min.x > extent[i].x)
			min.x=extent[i].x;
		if (min.y > extent[i].y)
			min.y=extent[i].y;
		if (max.x < extent[i].x)
			max.x=extent[i].x;
		if (max.y < extent[i].y)
			max.y=extent[i].y;
	}
	bbox->x = (int) min.x;
	bbox->y = (int) min.y;
	bbox->width  = (int) ceil((max.x - min.x)) + 1;
	bbox->height = (int) ceil(max.y - min.y) + 1;

	return GD_TRUE;
}